

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O0

uchar * __thiscall vm_val_t::get_as_codeptr(vm_val_t *this)

{
  pool_ofs_t ofs;
  CVmPoolInMem *in_RDI;
  uchar *local_8;
  
  ofs = *(pool_ofs_t *)&(in_RDI->super_CVmPoolPaged).super_CVmPool._vptr_CVmPool;
  if (ofs == 4) {
    local_8 = (uchar *)(in_RDI->super_CVmPoolPaged).super_CVmPool.page_size_;
  }
  else if (ofs == 0xb || ofs == 0xc) {
    local_8 = (uchar *)CVmPoolInMem::get_ptr(in_RDI,ofs);
  }
  else {
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

const uchar *vm_val_t::get_as_codeptr(VMG0_) const
{
    /* check my type */
    switch (typ)
    {
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* 
         *   these types contain code pool offsets - translate the offset to
         *   a physical pointer 
         */
        return (const uchar *)G_code_pool->get_ptr(val.ofs);

    case VM_CODEPTR:
        /* it's already a physical code pointer */
        return (const uchar *)val.ptr;
        
    default:
        /* other types do not contain code pointers */
        return 0;
    }
}